

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgStatement.cpp
# Opt level: O2

void __thiscall
rsg::AssignStatement::AssignStatement
          (AssignStatement *this,GeneratorState *state,Variable *variable,
          ConstValueRangeAccess valueRange)

{
  Expression *pEVar1;
  ExpressionGenerator generator;
  ValueRange local_88;
  
  (this->super_Statement)._vptr_Statement = (_func_int **)&PTR__AssignStatement_01e72410;
  this->m_variable = variable;
  this->m_valueExpr = (Expression *)0x0;
  ExpressionGenerator::ExpressionGenerator(&generator,state);
  ValueRange::ValueRange(&local_88,valueRange);
  pEVar1 = ExpressionGenerator::generate(&generator,&local_88,1);
  this->m_valueExpr = pEVar1;
  ValueRange::~ValueRange(&local_88);
  ExpressionGenerator::~ExpressionGenerator(&generator);
  return;
}

Assistant:

AssignStatement::AssignStatement (GeneratorState& state, const Variable* variable, ConstValueRangeAccess valueRange)
	: m_variable	(variable)
	, m_valueExpr	(DE_NULL)
{
	// Generate random value
	ExpressionGenerator generator(state);
	m_valueExpr = generator.generate(valueRange, 1);
}